

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collections.cpp
# Opt level: O0

int Lodtalk::ByteString::stSplitVariableNames(InterpreterProxy *interpreter)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  string local_48;
  anon_union_8_4_0eb573b0_for_Oop_0 local_28;
  Oop result;
  Oop self;
  InterpreterProxy *interpreter_local;
  
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    result.field_0._0_4_ = (*interpreter->_vptr_InterpreterProxy[0xb])();
    result.field_0.uintValue._4_4_ = extraout_var_00;
    iVar1 = (**interpreter->_vptr_InterpreterProxy)();
    getString_abi_cxx11_(&local_48,(ByteString *)result.field_0);
    local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)
               splitVariableNames((VMContext *)CONCAT44(extraout_var_01,iVar1),&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    interpreter_local._4_4_ =
         (*interpreter->_vptr_InterpreterProxy[0x17])(interpreter,local_28.pointer);
  }
  else {
    interpreter_local._4_4_ = (*interpreter->_vptr_InterpreterProxy[0x1e])();
  }
  return interpreter_local._4_4_;
}

Assistant:

int ByteString::stSplitVariableNames(InterpreterProxy *interpreter)
{
    if(interpreter->getArgumentCount() != 0)
        return interpreter->primitiveFailed();

    Oop self = interpreter->getReceiver();
    Oop result = splitVariableNames(interpreter->getContext(), reinterpret_cast<ByteString*> (self.pointer)->getString());
    return interpreter->returnOop(result);
}